

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

Color __thiscall nite::Color::operator/(Color *this,float c)

{
  Color *in_RSI;
  undefined8 extraout_XMM0_Qa;
  ulong uVar1;
  Color CVar2;
  float c_local;
  Color *this_local;
  Color *b;
  
  Color(this,in_RSI);
  this->r = this->r / c;
  this->g = this->g / c;
  uVar1 = (ulong)(uint)c;
  this->b = this->b / c;
  rectify(this);
  CVar2.b = (float)(int)uVar1;
  CVar2.a = (float)(int)(uVar1 >> 0x20);
  CVar2.r = (float)(int)extraout_XMM0_Qa;
  CVar2.g = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return CVar2;
}

Assistant:

nite::Color nite::Color::operator/(float c){
	auto b = *this;
	b.r /= c;
	b.g /= c;
	b.b /= c;
	b.rectify();
	return b;
}